

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

iterator __thiscall
phmap::priv::
btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
::erase_from_leaf_node
          (btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
           *this,iterator _begin,size_type to_erase)

{
  long lVar1;
  btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  bVar2;
  ulong uVar3;
  btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  *pbVar4;
  btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  *pbVar5;
  long lVar6;
  iterator iVar7;
  
  pbVar4 = _begin.node;
  if (((undefined1  [16])_begin & (undefined1  [16])0x7) != (undefined1  [16])0x0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0xf84,
                  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *, unsigned char, std::pair<int, int>, phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *, unsigned char, std::pair<int, int>, phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
                 );
  }
  if (pbVar4[0xb] ==
      (btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
       )0x0) {
    __assert_fail("node->leaf()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb03,
                  "iterator phmap::priv::btree<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>>::erase_from_leaf_node(iterator, size_type) [Params = phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>]"
                 );
  }
  bVar2 = pbVar4[10];
  uVar3 = (ulong)(byte)bVar2;
  if ((int)(uint)(byte)bVar2 <= _begin.position) {
    __assert_fail("node->count() > _begin.position",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb04,
                  "iterator phmap::priv::btree<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>>::erase_from_leaf_node(iterator, size_type) [Params = phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>]"
                 );
  }
  lVar6 = (long)_begin.position;
  if (lVar6 + to_erase <= uVar3) {
    if (pbVar4 + to_erase * 8 + lVar6 * 8 + 0xc != pbVar4 + uVar3 * 8 + 0xc) {
      pbVar5 = pbVar4 + lVar6 * 8 + 0x10;
      lVar1 = to_erase * 8;
      lVar6 = uVar3 * 8 + lVar6 * -8;
      do {
        *(undefined4 *)(pbVar5 + -4) = *(undefined4 *)(pbVar5 + lVar1 + -4);
        *(undefined4 *)pbVar5 = *(undefined4 *)(pbVar5 + lVar1);
        pbVar5 = pbVar5 + 8;
        lVar6 = lVar6 + -8;
      } while (lVar1 - lVar6 != 0);
      bVar2 = pbVar4[10];
    }
    pbVar4[10] = (btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                  )((char)bVar2 - (char)to_erase);
    this->size_ = this->size_ - to_erase;
    iVar7 = rebalance_after_delete(this,_begin);
    return iVar7;
  }
  __assert_fail("_begin.position + to_erase <= node->count()",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0xb05,
                "iterator phmap::priv::btree<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>>::erase_from_leaf_node(iterator, size_type) [Params = phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>]"
               );
}

Assistant:

auto btree<P>::erase_from_leaf_node(iterator _begin, size_type to_erase)
        -> iterator {
        node_type *node = _begin.node;
        assert(node->leaf());
        assert(node->count() > _begin.position);
        assert(_begin.position + to_erase <= node->count());

        node->remove_values_ignore_children(_begin.position, to_erase,
                                            mutable_allocator());

        size_ -= to_erase;

        return rebalance_after_delete(_begin);
    }